

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O0

int64_t duckdb::DateDiff::WeekOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
                  (dtime_t startdate,dtime_t enddate)

{
  string *msg;
  allocator *this;
  allocator local_31;
  string local_30 [48];
  
  msg = (string *)__cxa_allocate_exception(0x10);
  this = &local_31;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"\"time\" units \"week\" not recognized",this);
  NotImplementedException::NotImplementedException((NotImplementedException *)this,msg);
  __cxa_throw(msg,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

int64_t DateDiff::WeekOperator::Operation(dtime_t startdate, dtime_t enddate) {
	throw NotImplementedException("\"time\" units \"week\" not recognized");
}